

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

int32_t intersect_skewed_uint16
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l,uint16_t *buffer)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ushort *puVar11;
  ulong uVar12;
  uint uVar13;
  uint16_t *puVar14;
  uint16_t *puVar15;
  int iVar16;
  ulong uVar17;
  ushort *puVar18;
  ulong uVar19;
  int iVar20;
  ushort *puVar21;
  ulong uVar22;
  uint16_t *puVar23;
  ushort *puVar24;
  ulong uVar25;
  bool bVar26;
  
  if (size_s == 0) {
    puVar23 = (uint16_t *)0x0;
  }
  else {
    bVar26 = size_l != 0;
    iVar16 = (int)size_l;
    if (size_l == 0 || size_s < 4) {
      iVar20 = 0;
      iVar10 = 0;
      uVar7 = 0;
      uVar17 = 0;
      puVar23 = (uint16_t *)0x0;
      puVar14 = small;
    }
    else {
      uVar17 = 0;
      uVar19 = 0;
      uVar25 = 0;
      uVar12 = 0;
      uVar22 = 0;
      uVar9 = 0;
      uVar6 = 4;
      puVar23 = (uint16_t *)0x0;
      do {
        puVar14 = puVar23;
        uVar7 = uVar6;
        uVar2 = small[uVar9];
        uVar3 = small[uVar9 + 1];
        uVar4 = small[uVar9 + 2];
        uVar5 = small[uVar9 + 3];
        uVar13 = iVar16 - (int)uVar17;
        if (uVar13 != 0) {
          puVar1 = large + uVar17;
          puVar11 = puVar1;
          puVar18 = puVar1;
          puVar21 = puVar1;
          puVar24 = puVar1;
          for (; 1 < (int)uVar13; uVar13 = uVar13 - (uVar13 >> 1)) {
            uVar9 = (ulong)(uVar13 & 0xfffffffe);
            if (*(ushort *)((long)puVar21 + uVar9) < uVar2) {
              puVar21 = (ushort *)((long)puVar21 + uVar9);
            }
            if (*(ushort *)((long)puVar11 + uVar9) < uVar3) {
              puVar11 = (ushort *)((long)puVar11 + uVar9);
            }
            if (*(ushort *)((long)puVar24 + uVar9) < uVar4) {
              puVar24 = (ushort *)((long)puVar24 + uVar9);
            }
            if (*(ushort *)((long)puVar18 + uVar9) < uVar5) {
              puVar18 = (ushort *)((long)puVar18 + uVar9);
            }
          }
          uVar22 = (long)puVar21 + ((ulong)(*puVar21 < uVar2) * 2 - (long)puVar1) >> 1;
          uVar12 = (long)puVar11 + ((ulong)(*puVar11 < uVar3) * 2 - (long)puVar1) >> 1;
          uVar25 = (long)puVar24 + ((ulong)(*puVar24 < uVar4) * 2 - (long)puVar1) >> 1;
          uVar19 = (long)puVar18 + ((ulong)(*puVar18 < uVar5) * 2 - (long)puVar1) >> 1;
        }
        iVar10 = (int)uVar12;
        iVar20 = (int)uVar22;
        puVar23 = puVar14;
        if (((long)iVar20 + uVar17 < size_l) && (large[(long)iVar20 + uVar17] == uVar2)) {
          buffer[(long)puVar14] = uVar2;
          puVar23 = (uint16_t *)((long)puVar14 + 1);
        }
        if (((long)iVar10 + uVar17 < size_l) && (large[(long)iVar10 + uVar17] == uVar3)) {
          buffer[(long)puVar23] = uVar3;
          puVar23 = (uint16_t *)((long)puVar23 + 1);
        }
        uVar9 = (long)(int)uVar25 + uVar17;
        if ((uVar9 < size_l) && (large[uVar9] == uVar4)) {
          buffer[(long)puVar23] = uVar4;
          puVar23 = (uint16_t *)((long)puVar23 + 1);
        }
        uVar17 = uVar17 + (long)(int)uVar19;
        if ((uVar17 < size_l) && (large[uVar17] == uVar5)) {
          buffer[(long)puVar23] = uVar5;
          puVar23 = (uint16_t *)((long)puVar23 + 1);
        }
        bVar26 = uVar17 < size_l;
      } while ((uVar7 + 4 <= size_s) && (uVar9 = uVar7, uVar6 = uVar7 + 4, uVar17 < size_l));
    }
    uVar9 = uVar7 | 2;
    if ((uVar9 <= size_s) && (bVar26)) {
      uVar2 = small[uVar7];
      uVar3 = small[uVar7 + 1];
      uVar13 = iVar16 - (int)uVar17;
      if (uVar13 != 0) {
        puVar1 = large + uVar17;
        puVar11 = puVar1;
        puVar18 = puVar1;
        for (; 1 < (int)uVar13; uVar13 = uVar13 - (uVar13 >> 1)) {
          uVar7 = (ulong)(uVar13 & 0xfffffffe);
          if (*(ushort *)((long)puVar18 + uVar7) < uVar2) {
            puVar18 = (ushort *)((long)puVar18 + uVar7);
          }
          if (*(ushort *)((long)puVar11 + uVar7) < uVar3) {
            puVar11 = (ushort *)((long)puVar11 + uVar7);
          }
        }
        iVar20 = (int)((long)puVar18 + ((ulong)(*puVar18 < uVar2) * 2 - (long)puVar1) >> 1);
        iVar10 = (int)((long)puVar11 + ((ulong)(*puVar11 < uVar3) * 2 - (long)puVar1) >> 1);
      }
      if (((long)iVar20 + uVar17 < size_l) && (large[(long)iVar20 + uVar17] == uVar2)) {
        buffer[(long)puVar23] = uVar2;
        puVar23 = (uint16_t *)((long)puVar23 + 1);
      }
      uVar17 = uVar17 + (long)iVar10;
      uVar7 = uVar9;
      if ((uVar17 < size_l) && (large[uVar17] == uVar3)) {
        buffer[(long)puVar23] = uVar3;
        puVar23 = (uint16_t *)((long)puVar23 + 1);
      }
    }
    if ((uVar7 < size_s) && (uVar17 < size_l)) {
      uVar2 = small[uVar7];
      iVar16 = ~(uint)uVar17 + iVar16;
      uVar13 = 0;
      do {
        if (iVar16 < (int)uVar13) {
          uVar8 = ~uVar13;
          break;
        }
        uVar8 = uVar13 + iVar16 >> 1;
        puVar15 = (uint16_t *)(ulong)uVar8;
        uVar3 = *(ushort *)((long)large + (ulong)(uVar13 + iVar16 & 0xfffffffe) + uVar17 * 2);
        if (uVar3 < uVar2) {
          uVar13 = uVar8 + 1;
          bVar26 = true;
          puVar15 = puVar14;
        }
        else if (uVar2 < uVar3) {
          iVar16 = uVar8 - 1;
          bVar26 = true;
          puVar15 = puVar14;
        }
        else {
          bVar26 = false;
        }
        uVar8 = (uint)puVar15;
        puVar14 = puVar15;
      } while (bVar26);
      if (-1 < (int)uVar8) {
        buffer[(long)puVar23] = uVar2;
        puVar23 = (uint16_t *)((long)puVar23 + 1);
      }
    }
  }
  return (int32_t)puVar23;
}

Assistant:

int32_t intersect_skewed_uint16(const uint16_t *small, size_t size_s,
                                const uint16_t *large, size_t size_l,
                                uint16_t *buffer) {
    size_t pos = 0, idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return 0;
    }
    int32_t index1 = 0, index2 = 0, index3 = 0, index4 = 0;
    while ((idx_s + 4 <= size_s) && (idx_l < size_l)) {
        uint16_t target1 = small[idx_s];
        uint16_t target2 = small[idx_s + 1];
        uint16_t target3 = small[idx_s + 2];
        uint16_t target4 = small[idx_s + 3];
        binarySearch4(large + idx_l, (int32_t)(size_l - idx_l), target1,
                      target2, target3, target4, &index1, &index2, &index3,
                      &index4);
        if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
            buffer[pos++] = target1;
        }
        if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
            buffer[pos++] = target2;
        }
        if ((index3 + idx_l < size_l) && (large[idx_l + index3] == target3)) {
            buffer[pos++] = target3;
        }
        if ((index4 + idx_l < size_l) && (large[idx_l + index4] == target4)) {
            buffer[pos++] = target4;
        }
        idx_s += 4;
        idx_l += index4;
    }
    if ((idx_s + 2 <= size_s) && (idx_l < size_l)) {
        uint16_t target1 = small[idx_s];
        uint16_t target2 = small[idx_s + 1];
        binarySearch2(large + idx_l, (int32_t)(size_l - idx_l), target1,
                      target2, &index1, &index2);
        if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
            buffer[pos++] = target1;
        }
        if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
            buffer[pos++] = target2;
        }
        idx_s += 2;
        idx_l += index2;
    }
    if ((idx_s < size_s) && (idx_l < size_l)) {
        uint16_t val_s = small[idx_s];
        int32_t index =
            binarySearch(large + idx_l, (int32_t)(size_l - idx_l), val_s);
        if (index >= 0) buffer[pos++] = val_s;
    }
    return (int32_t)pos;
}